

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.cpp
# Opt level: O1

json_null __thiscall json_deserializer::deserialize_null(json_deserializer *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  ostream *poVar3;
  int iVar4;
  int *in_RSI;
  size_type sVar5;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_50,*(char *)(*(long *)(in_RSI + 2) + (long)*in_RSI));
  iVar4 = 3;
  do {
    if ((long)*in_RSI + 1U < *(ulong *)(in_RSI + 4)) {
      *in_RSI = (int)((long)*in_RSI + 1U);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_50,*(char *)(*(long *)(in_RSI + 2) + (long)*in_RSI));
    sVar2 = local_50._M_string_length;
    _Var1._M_p = local_50._M_dataplus._M_p;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_50._M_string_length != 0) {
    sVar5 = 0;
    do {
      iVar4 = tolower((int)_Var1._M_p[sVar5]);
      _Var1._M_p[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_50,"null");
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Expected \'null\', found ",0x17);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  *(undefined ***)&this->reader = &PTR_get_type_0012da30;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return (json_null)(json_element)this;
}

Assistant:

json_null deserialize_null() {
        string str;
        str += reader.current();
        int i = 1;
        while (i < 4) {
            reader.next();
            str += reader.current();
            i++;
        }
        transform(str.begin(), str.end(), str.begin(), ::tolower);
        if (str != "null") {
            cerr << "Expected 'null', found " << str << endl;
        }
        return json_null_instance;
    }